

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalLibraryBase.cpp
# Opt level: O2

void __thiscall
Js::ExternalLibraryBase::Initialize(ExternalLibraryBase *this,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *this_00;
  ExternalLibraryBase *pEVar4;
  
  if (this->javascriptLibrary == (JavascriptLibrary *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                ,0x13,"(this->javascriptLibrary == nullptr)",
                                "this->javascriptLibrary == nullptr");
    if (!bVar2) goto LAB_00a22ced;
    *puVar3 = 0;
  }
  this->javascriptLibrary = library;
  this->scriptContext = (library->super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = &library->externalLibraryList;
  pEVar4 = (ExternalLibraryBase *)this_00;
  while( true ) {
    do {
      pEVar4 = pEVar4->next;
      if (pEVar4 == (ExternalLibraryBase *)0x0) {
        this->next = this_00->ptr;
        Memory::WriteBarrierPtr<Js::ExternalLibraryBase>::WriteBarrierSet(this_00,this);
        return;
      }
    } while (pEVar4 != this);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                ,0x1a,"(current != this)","current != this");
    if (!bVar2) break;
    *puVar3 = 0;
  }
LAB_00a22ced:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ExternalLibraryBase::Initialize(JavascriptLibrary* library)
    {
        Assert(this->javascriptLibrary == nullptr);
        this->javascriptLibrary = library;
        this->scriptContext = library->GetScriptContext();
#if DBG
        ExternalLibraryBase* current = library->externalLibraryList;
        while (current != nullptr)
        {
            Assert(current != this);
            current = current->next;
        }
#endif
        this->next = library->externalLibraryList;
        library->externalLibraryList = this;
    }